

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void SetWindowConditionAllowFlags(ImGuiWindow *window,ImGuiCond flags,bool enabled)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined7 in_register_00000011;
  uint uVar5;
  
  uVar1 = *(uint *)&window->field_0xb4;
  uVar5 = ~flags;
  iVar4 = (int)CONCAT71(in_register_00000011,enabled);
  uVar2 = uVar1 >> 0x10 & uVar5;
  if (iVar4 != 0) {
    uVar2 = uVar1 >> 0x10 | flags;
  }
  uVar3 = uVar1 >> 8 & uVar5;
  if (iVar4 != 0) {
    uVar3 = uVar1 >> 8 | flags;
  }
  uVar5 = uVar5 & uVar1;
  if (iVar4 != 0) {
    uVar5 = flags | uVar1;
  }
  *(uint *)&window->field_0xb4 =
       (uVar2 & 0xff) << 0x10 | (uVar3 & 0xff) << 8 | uVar1 & 0xff000000 | uVar5 & 0xff;
  return;
}

Assistant:

static void SetWindowConditionAllowFlags(ImGuiWindow* window, ImGuiCond flags, bool enabled)
{
    window->SetWindowPosAllowFlags       = enabled ? (window->SetWindowPosAllowFlags       | flags) : (window->SetWindowPosAllowFlags       & ~flags);
    window->SetWindowSizeAllowFlags      = enabled ? (window->SetWindowSizeAllowFlags      | flags) : (window->SetWindowSizeAllowFlags      & ~flags);
    window->SetWindowCollapsedAllowFlags = enabled ? (window->SetWindowCollapsedAllowFlags | flags) : (window->SetWindowCollapsedAllowFlags & ~flags);
}